

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O2

void __thiscall spv::Builder::setDebugSourceLocation(Builder *this,int line,char *filename)

{
  Id IVar1;
  allocator<char> local_31;
  string local_30;
  
  if (((this->trackDebugInfo == true) && (this->dirtyLineTracker = true, line != 0)) &&
     (this->currentLine = line, filename != (char *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,filename,&local_31);
    IVar1 = getStringId(this,&local_30);
    this->currentFileId = IVar1;
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void setDebugSourceLocation(int line, const char* filename)
    {
        if (trackDebugInfo) {
            dirtyLineTracker = true;
            if (line != 0) {
                // TODO: This is special handling of some AST nodes having (untracked) line 0. 
                //       But they should have a valid line number.
                currentLine = line;
                if (filename) {
                    currentFileId = getStringId(filename);
                }
            }
        }
    }